

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O0

int pt_evt_decode_pwre(pt_event_decoder *decoder,pt_packet_pwre *packet)

{
  pt_event *ev_00;
  int errcode;
  pt_event *ev;
  pt_packet_pwre *packet_local;
  pt_event_decoder *decoder_local;
  
  if ((decoder == (pt_event_decoder *)0x0) || (packet == (pt_packet_pwre *)0x0)) {
    decoder_local._4_4_ = -1;
  }
  else {
    ev_00 = pt_evq_standalone(&decoder->evq);
    decoder->event = ev_00;
    if (ev_00 == (pt_event *)0x0) {
      decoder_local._4_4_ = -1;
    }
    else {
      ev_00->type = ptev_pwre;
      (ev_00->variant).sipi.vector = packet->state;
      (ev_00->variant).pwre.sub_state = packet->sub_state;
      if ((packet->field_0x2 & 1) != 0) {
        *(byte *)((long)&ev_00->variant + 2) = *(byte *)((long)&ev_00->variant + 2) & 0xfe | 1;
      }
      decoder_local._4_4_ = pt_evt_event_time(ev_00,&decoder->time);
      if (-1 < decoder_local._4_4_) {
        decoder_local._4_4_ = pt_evt_fetch_packet(decoder);
      }
    }
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_evt_decode_pwre(struct pt_event_decoder *decoder,
			      const struct pt_packet_pwre *packet)
{
	struct pt_event *ev;
	int errcode;

	if (!decoder || !packet)
		return -pte_internal;

	decoder->event = ev = pt_evq_standalone(&decoder->evq);
	if (!ev)
		return -pte_internal;

	ev->type = ptev_pwre;
	ev->variant.pwre.state = packet->state;
	ev->variant.pwre.sub_state = packet->sub_state;

	if (packet->hw)
		ev->variant.pwre.hw = 1;

	errcode = pt_evt_event_time(ev, &decoder->time);
	if (errcode < 0)
		return errcode;

	return pt_evt_fetch_packet(decoder);
}